

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O2

LY_ERR lyb_parse_siblings(lyd_lyb_ctx *lybctx,lyd_node *parent,lyd_node **first_p,ly_set *parsed)

{
  ushort uVar1;
  lyd_lyb_sibling *plVar2;
  ly_ctx *plVar3;
  lyd_meta *__s;
  lyd_ctx *value_00;
  LY_VALUE_FORMAT LVar4;
  char *value_01;
  char *module_key_00;
  ly_in *__ptr;
  LY_ERR ret__;
  LY_ERR LVar5;
  LY_ERR LVar6;
  lysc_node *plVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  lyd_attr *plVar11;
  lylyb_ctx *plVar12;
  long lVar13;
  lys_module *mod_00;
  LYD_ANYDATA_VALUETYPE value_type;
  lyd_meta *__s_00;
  char *pcVar14;
  char *pcVar15;
  ly_bool dynamic_1;
  ly_bool dynamic;
  char *name;
  lyd_meta *meta;
  uint8_t count;
  lyd_meta *meta_1;
  lyd_node *node_3;
  char *value;
  lyd_node *local_f8;
  lyd_attr *local_f0;
  lyd_lyb_ctx *local_e8;
  lyd_ctx *lydctx;
  ly_in *in;
  LY_VALUE_FORMAT format;
  lyd_node **local_c8;
  ly_set *local_c0;
  size_t local_b8;
  char *value_1;
  undefined4 local_a8;
  LY_VALUE_FORMAT format_1;
  lysc_node *snode;
  size_t local_98;
  char *mod_name;
  void *val_prefix_data;
  char *module_key;
  char *prefix;
  char *name_1;
  lylyb_node_type lyb_type;
  ly_ctx *local_60;
  lylyb_ctx *local_58;
  lys_module *mod;
  size_t local_40;
  ly_in *local_38;
  
  plVar2 = lybctx->lybctx->siblings;
  if (plVar2 == (lyd_lyb_sibling *)0x0) {
    local_a8 = 0;
  }
  else {
    local_a8 = (undefined4)
               CONCAT71((int7)((ulong)plVar2 >> 8),*(long *)&plVar2[-1].inner_chunks != 0);
  }
  local_c8 = first_p;
  local_c0 = parsed;
  LVar5 = lyb_read_start_siblings(lybctx->lybctx);
  local_f8 = parent;
  local_e8 = lybctx;
  if (LVar5 != LY_SUCCESS) {
    return LY_EMEM;
  }
LAB_00136361:
  lVar13 = -1;
  plVar12 = lybctx->lybctx;
  plVar2 = plVar12->siblings;
  if (plVar2 != (lyd_lyb_sibling *)0x0) {
    lVar13 = *(long *)&plVar2[-1].inner_chunks + -1;
  }
  if (plVar2[lVar13].written != 0) {
    mod_name = (char *)0x0;
    lyb_read_number(&lyb_type,4,1,plVar12);
    if (lyb_type - LYB_NODE_CHILD < 2) {
      plVar7 = lyd_parser_node_schema(parent);
      mod_00 = (lys_module *)0x0;
LAB_00136402:
      LVar5 = lyb_parse_schema_hash(lybctx,plVar7,mod_00,&snode);
      if (LVar5 != LY_SUCCESS) goto LAB_00136413;
LAB_0013641d:
      pcVar14 = (char *)0x0;
LAB_00136420:
      plVar7 = snode;
      if (snode == (lysc_node *)0x0) {
        node_3 = (lyd_node *)0x0;
        value_1 = (char *)0x0;
        name_1 = (char *)0x0;
        prefix = (char *)0x0;
        module_key = (char *)0x0;
        dynamic = '\0';
        format = LY_VALUE_CANON;
        val_prefix_data = (void *)0x0;
        local_58 = lybctx->lybctx;
        local_60 = local_58->ctx;
        name = (char *)0x0;
        meta = (lyd_meta *)0x0;
        meta_1 = (lyd_meta *)0x0;
        in = (ly_in *)0x0;
        lydctx = (lyd_ctx *)0x0;
        format_1 = LY_VALUE_CANON;
        dynamic_1 = '\0';
        value = (char *)0x0;
        lyb_read(&count,1,local_58);
        local_f0 = (lyd_attr *)0x0;
        sVar9 = 0;
        while (plVar12 = local_58, LVar5 = LY_SUCCESS, (byte)sVar9 < count) {
          local_98 = sVar9;
          LVar5 = lyb_read_string((char **)&meta,'\x02',local_58);
          __s_00 = meta;
          if (LVar5 != LY_SUCCESS) {
LAB_00136975:
            LVar5 = LY_EMEM;
            goto LAB_00136aa2;
          }
          if (*(char *)&meta->parent == '\0') {
            free(meta);
            meta = (lyd_meta *)0x0;
          }
          __s_00 = meta;
          LVar5 = lyb_read_string((char **)&meta_1,'\x02',plVar12);
          if (LVar5 != LY_SUCCESS) goto LAB_00136975;
          if (*(char *)&meta_1->parent == '\0') {
            free(meta_1);
            meta_1 = (lyd_meta *)0x0;
          }
          __s = meta_1;
          LVar5 = lyb_read_string((char **)&in,'\x02',plVar12);
          if (LVar5 != LY_SUCCESS) {
            LVar5 = LY_EMEM;
            lybctx = local_e8;
            goto LAB_00136aa2;
          }
          lyb_read_number(&format_1,4,1,plVar12);
          LVar4 = format_1;
          LVar5 = lyb_parse_prefix_data(plVar12,format_1,&value);
          lybctx = local_e8;
          parent = local_f8;
          if (LVar5 != LY_SUCCESS) goto LAB_00136aa2;
          LVar5 = lyb_read_string((char **)&lydctx,'\b',plVar12);
          if (LVar5 != LY_SUCCESS) {
            ly_free_prefix_data(LVar4,value);
            LVar5 = LY_EMEM;
            lybctx = local_e8;
            parent = local_f8;
            goto LAB_00136aa2;
          }
          dynamic_1 = '\x01';
          plVar3 = plVar12->ctx;
          local_38 = in;
          sVar8 = strlen((char *)in);
          if (__s_00 == (lyd_meta *)0x0) {
            local_b8 = 0;
          }
          else {
            local_b8 = strlen((char *)__s_00);
          }
          local_40 = sVar8;
          if (__s == (lyd_meta *)0x0) {
            sVar8 = 0;
          }
          else {
            sVar8 = strlen((char *)__s);
          }
          value_00 = lydctx;
          if (lydctx == (lyd_ctx *)0x0) {
            sVar9 = 0;
          }
          else {
            sVar9 = strlen((char *)lydctx);
          }
          __ptr = local_38;
          LVar5 = lyd_create_attr((lyd_node *)0x0,(lyd_attr **)&name,plVar3,(char *)local_38,
                                  local_40,(char *)__s_00,local_b8,(char *)__s,sVar8,
                                  (char *)value_00,sVar9,&dynamic_1,LVar4,value,0x3f3);
          lybctx = local_e8;
          parent = local_f8;
          if (LVar5 != LY_SUCCESS) goto LAB_00136aa2;
          free(__s_00);
          meta = (lyd_meta *)0x0;
          free(__s);
          meta_1 = (lyd_meta *)0x0;
          free(__ptr);
          in = (ly_in *)0x0;
          if (dynamic_1 != '\0') {
            __assert_fail("!dynamic",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                          ,0x2af,
                          "LY_ERR lyb_parse_attributes(struct lylyb_ctx *, struct lyd_attr **)");
          }
          lydctx = (lyd_ctx *)0x0;
          if (local_f0 == (lyd_attr *)0x0) {
            local_f0 = (lyd_attr *)name;
          }
          lybctx = local_e8;
          parent = local_f8;
          sVar9 = CONCAT71((int7)(local_98 >> 8),(char)local_98 + '\x01');
        }
        __s_00 = (lyd_meta *)0x0;
LAB_00136aa2:
        free(__s_00);
        free(meta_1);
        free(in);
        if (dynamic_1 != '\0') {
          free(lydctx);
        }
        if (LVar5 == LY_SUCCESS) {
          lyb_read_number(&name,4,4,lybctx->lybctx);
          LVar5 = lyb_read_string(&prefix,'\x02',lybctx->lybctx);
          if (((LVar5 == LY_SUCCESS) &&
              (LVar5 = lyb_read_string(&module_key,'\x02',lybctx->lybctx), LVar5 == LY_SUCCESS)) &&
             (LVar5 = lyb_read_string(&name_1,'\x02',lybctx->lybctx), LVar5 == LY_SUCCESS)) {
            LVar5 = lyb_read_string(&value_1,'\b',lybctx->lybctx);
            if (LVar5 == LY_SUCCESS) {
              dynamic = '\x01';
              lyb_read_number(&format,4,1,lybctx->lybctx);
              LVar4 = format;
              LVar5 = lyb_parse_prefix_data(lybctx->lybctx,format,&val_prefix_data);
              pcVar14 = name_1;
              if (LVar5 == LY_SUCCESS) {
                if (((ulong)lybctx->field_1 & 0x40000) == 0) {
                  LVar5 = lyb_read_start_siblings(lybctx->lybctx);
                  if (LVar5 == LY_SUCCESS) {
                    lyb_skip_siblings(lybctx->lybctx);
                    LVar5 = lyb_read_stop_siblings(lybctx->lybctx);
                  }
                  else {
                    LVar5 = LY_EMEM;
                  }
                }
                else {
                  local_98 = strlen(name_1);
                  pcVar15 = prefix;
                  if (prefix == (char *)0x0) {
                    local_b8 = 0;
                  }
                  else {
                    local_b8 = strlen(prefix);
                  }
                  module_key_00 = module_key;
                  if (module_key == (char *)0x0) {
                    sVar8 = 0;
                  }
                  else {
                    sVar8 = strlen(module_key);
                  }
                  value_01 = value_1;
                  sVar10 = strlen(value_1);
                  LVar5 = lyd_create_opaq(local_60,pcVar14,local_98,pcVar15,local_b8,module_key_00,
                                          sVar8,value_01,sVar10,&dynamic,LVar4,val_prefix_data,0x3f3
                                          ,&node_3);
                  lybctx = local_e8;
                  parent = local_f8;
                  if (LVar5 == LY_SUCCESS) {
                    if (node_3 == (lyd_node *)0x0) {
                      __assert_fail("node",
                                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                    ,0x48f,
                                    "LY_ERR lyb_parse_node_opaq(struct lyd_lyb_ctx *, struct lyd_node *, struct lyd_node **, struct ly_set *)"
                                   );
                    }
                    ly_log_location((lysc_node *)0x0,node_3,(char *)0x0,(ly_in *)0x0);
                    LVar5 = lyb_parse_siblings(lybctx,node_3,(lyd_node **)0x0,(ly_set *)0x0);
                    parent = local_f8;
                    if (LVar5 == LY_SUCCESS) {
                      node_3->flags = (uint32_t)name;
                      plVar11 = local_f0;
                      if (node_3->schema != (lysc_node *)0x0) {
                        __assert_fail("!(*node)->schema",
                                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                      ,0x3c9,
                                      "void lyb_finish_opaq(struct lyd_lyb_ctx *, struct lyd_node *, uint32_t, struct lyd_attr **, struct lyd_node **, struct lyd_node **, struct ly_set *)"
                                     );
                      }
                      for (; plVar11 != (lyd_attr *)0x0; plVar11 = plVar11->next) {
                        plVar11->parent = (lyd_node_opaq *)node_3;
                      }
                      *(lyd_attr **)(node_3 + 2) = local_f0;
                      lyb_insert_node(lybctx,local_f8,node_3,local_c8,local_c0);
                      node_3 = (lyd_node *)0x0;
                      local_f0 = (lyd_attr *)0x0;
                      ly_log_location_revert(0,1,0,0);
                      LVar5 = LY_SUCCESS;
                    }
                  }
                }
              }
              goto LAB_00136b9b;
            }
            ly_free_prefix_data(format,val_prefix_data);
          }
          LVar5 = LY_EMEM;
        }
        else {
          lyd_free_attr_siblings(local_58->ctx,local_f0);
          local_f0 = (lyd_attr *)0x0;
        }
LAB_00136b9b:
        if (node_3 != (lyd_node *)0x0) {
          ly_log_location_revert(0,1,0,0);
        }
        free(prefix);
        free(module_key);
        free(name_1);
        if (dynamic != '\0') {
          free(value_1);
        }
        lyd_free_attr_siblings(local_60,local_f0);
        lyd_free_tree(node_3);
        pcVar14 = mod_name;
      }
      else {
        uVar1 = snode->nodetype;
        if ((uVar1 & 8) == 0) {
          if (uVar1 == 0x10) {
            name = (char *)0x0;
            meta = (lyd_meta *)0x0;
            LVar6 = lyb_read_start_siblings(lybctx->lybctx);
            LVar5 = LY_EMEM;
            if (LVar6 == LY_SUCCESS) {
              while( true ) {
                plVar12 = lybctx->lybctx;
                plVar2 = plVar12->siblings;
                lVar13 = -1;
                if (plVar2 != (lyd_lyb_sibling *)0x0) {
                  lVar13 = *(long *)&plVar2[-1].inner_chunks + -1;
                }
                if (plVar2[lVar13].written == 0) break;
                LVar5 = lyb_parse_node_header(lybctx,plVar7,(uint32_t *)&meta_1,&meta);
                if ((LVar5 != LY_SUCCESS) ||
                   (LVar5 = lyd_create_inner(plVar7,(lyd_node **)&name), LVar5 != LY_SUCCESS))
                goto LAB_00136cef;
                if (name == (char *)0x0) {
                  __assert_fail("node",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                ,0x5a9,
                                "LY_ERR lyb_parse_node_list(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                               );
                }
                ly_log_location((lysc_node *)0x0,(lyd_node *)name,(char *)0x0,(ly_in *)0x0);
                LVar5 = lyb_parse_siblings(lybctx,(lyd_node *)name,(lyd_node **)0x0,(ly_set *)0x0);
                if ((LVar5 != LY_SUCCESS) ||
                   (LVar5 = lyb_validate_node_inner(lybctx,(lyd_node *)name), LVar5 != LY_SUCCESS))
                goto LAB_00136855;
                if ((plVar7->nodetype & 0x700) != 0) {
                  lybctx->op_node = (lyd_node *)name;
                }
                lyb_finish_node(lybctx,parent,(uint32_t)meta_1,&meta,(lyd_node **)&name,local_c8,
                                local_c0);
                ly_log_location_revert(0,1,0,0);
              }
LAB_00136980:
              LVar5 = lyb_read_stop_siblings(plVar12);
            }
          }
          else if ((uVar1 & 0x60) == 0) {
            if ((uVar1 & 0x711) == 0) {
              LVar5 = lyb_parse_node_leaf(lybctx,parent,snode,local_c8,local_c0);
            }
            else {
              name = (char *)0x0;
              meta = (lyd_meta *)0x0;
              LVar5 = lyb_parse_node_header(lybctx,snode,(uint32_t *)&meta_1,&meta);
              if ((LVar5 == LY_SUCCESS) &&
                 (LVar5 = lyd_create_inner(plVar7,(lyd_node **)&name), LVar5 == LY_SUCCESS)) {
                if (name == (char *)0x0) {
                  __assert_fail("node",
                                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                ,0x51f,
                                "LY_ERR lyb_parse_node_inner(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                               );
                }
                ly_log_location((lysc_node *)0x0,(lyd_node *)name,(char *)0x0,(ly_in *)0x0);
                LVar5 = lyb_parse_siblings(lybctx,(lyd_node *)name,(lyd_node **)0x0,(ly_set *)0x0);
                if ((LVar5 == LY_SUCCESS) &&
                   (LVar5 = lyb_validate_node_inner(lybctx,(lyd_node *)name), LVar5 == LY_SUCCESS))
                {
                  if ((plVar7->nodetype & 0x700) != 0) {
                    lybctx->op_node = (lyd_node *)name;
                  }
                  lyb_finish_node(lybctx,parent,(uint32_t)meta_1,&meta,(lyd_node **)&name,local_c8,
                                  local_c0);
                  LVar5 = LY_SUCCESS;
                  ly_log_location_revert(0,1,0,0);
                  goto LAB_00136d84;
                }
              }
              if (name != (char *)0x0) {
                ly_log_location_revert(0,1,0,0);
              }
              lyd_free_meta_siblings(meta);
              lyd_free_tree((lyd_node *)name);
            }
          }
          else {
            name = (char *)0x0;
            meta = (lyd_meta *)0x0;
            meta_1 = (lyd_meta *)0x0;
            lydctx = (lyd_ctx *)0x0;
            value = (char *)0x0;
            plVar3 = lybctx->lybctx->ctx;
            LVar5 = lyb_parse_node_header(lybctx,snode,(uint32_t *)&value_1,&meta_1);
            if (LVar5 == LY_SUCCESS) {
              lyb_read_number(&node_3,4,4,lybctx->lybctx);
              value_type = (LYD_ANYDATA_VALUETYPE)node_3;
              if (((LYD_ANYDATA_VALUETYPE)node_3 == LYD_ANYDATA_DATATREE) ||
                 (((LYD_ANYDATA_VALUETYPE)node_3 != LYD_ANYDATA_LYB && (plVar7->nodetype == 0x60))))
              {
LAB_00136c67:
                LVar5 = LY_EINT;
                ly_log(plVar3,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                       "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                      );
              }
              else {
                LVar6 = lyb_read_string(&value,'\b',lybctx->lybctx);
                pcVar15 = value;
                LVar5 = LY_EMEM;
                if (LVar6 == LY_SUCCESS) {
                  if (value_type == LYD_ANYDATA_LYB) {
                    LVar5 = ly_in_new_memory(value,&in);
                    parent = local_f8;
                    if (LVar5 != LY_SUCCESS) goto LAB_00136d84;
                    LVar5 = lyd_parse_lyb(plVar3,(lysc_ext_instance *)0x0,(lyd_node *)0x0,
                                          (lyd_node **)&meta,in,0x70000,0,0x30,(ly_set *)0x0,
                                          (ly_bool *)0x0,&lydctx);
                    ly_in_free(in,'\0');
                    if (lydctx != (lyd_ctx *)0x0) {
                      (*lydctx->free)(lydctx);
                    }
                    if (LVar5 == LY_SUCCESS) {
                      free(pcVar15);
                      value = (char *)meta;
                      value_type = LYD_ANYDATA_DATATREE;
                      goto LAB_00136f8e;
                    }
                    lyd_free_siblings((lyd_node *)meta);
                  }
                  else {
                    if (LYD_ANYDATA_JSON < value_type) goto LAB_00136c67;
LAB_00136f8e:
                    LVar5 = lyd_create_any(plVar7,value,value_type,'\x01',(lyd_node **)&name);
                    if (LVar5 == LY_SUCCESS) {
                      if (name == (char *)0x0) {
                        __assert_fail("node",
                                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                                      ,0x4f4,
                                      "LY_ERR lyb_parse_node_any(struct lyd_lyb_ctx *, struct lyd_node *, const struct lysc_node *, struct lyd_node **, struct ly_set *)"
                                     );
                      }
                      LVar5 = LY_SUCCESS;
                      ly_log_location((lysc_node *)0x0,(lyd_node *)name,(char *)0x0,(ly_in *)0x0);
                      lyb_finish_node(lybctx,local_f8,(uint32_t)value_1,&meta_1,(lyd_node **)&name,
                                      local_c8,local_c0);
                      ly_log_location_revert(0,1,0,0);
                      parent = local_f8;
                      goto LAB_00136d84;
                    }
                  }
                }
              }
            }
            free(value);
            lyd_free_meta_siblings(meta_1);
            lyd_free_tree((lyd_node *)name);
            parent = local_f8;
          }
        }
        else {
          LVar5 = lyb_read_start_siblings(lybctx->lybctx);
          if (LVar5 == LY_SUCCESS) {
            do {
              plVar12 = lybctx->lybctx;
              plVar2 = plVar12->siblings;
              lVar13 = -1;
              if (plVar2 != (lyd_lyb_sibling *)0x0) {
                lVar13 = *(long *)&plVar2[-1].inner_chunks + -1;
              }
              if (plVar2[lVar13].written == 0) goto LAB_00136980;
              LVar5 = lyb_parse_node_leaf(lybctx,parent,plVar7,local_c8,local_c0);
            } while (LVar5 == LY_SUCCESS);
          }
          else {
            LVar5 = LY_EMEM;
          }
        }
      }
    }
    else {
      if (lyb_type == LYB_NODE_EXT) {
        LVar5 = lyb_read_model(lybctx->lybctx,&mod_name,(char *)&mod,(ly_set *)0x0);
        pcVar14 = mod_name;
        if (LVar5 == LY_SUCCESS) {
          name = (char *)0x0;
          if (parent == (lyd_node *)0x0) {
            __assert_fail("parent",
                          "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_lyb.c"
                          ,0x366,
                          "LY_ERR lyb_parse_schema_nested_ext(struct lyd_lyb_ctx *, const struct lyd_node *, const char *, const struct lysc_node **)"
                         );
          }
          LVar5 = lyb_read_string(&name,'\x02',lybctx->lybctx);
          if (LVar5 == LY_SUCCESS) {
            if (pcVar14 == (char *)0x0) {
              sVar8 = 0;
            }
            else {
              sVar8 = strlen(pcVar14);
            }
            pcVar15 = name;
            sVar10 = strlen(name);
            LVar5 = ly_nested_ext_schema
                              (parent,(lysc_node *)0x0,pcVar14,sVar8,LY_VALUE_JSON,(void *)0x0,
                               pcVar15,sVar10,&snode,(lysc_ext_instance **)&meta);
            if (LVar5 == LY_SUCCESS) {
              lyb_cache_module_hash(snode->module);
              LVar5 = LY_SUCCESS;
            }
            else if (LVar5 == LY_ENOT) {
              LVar5 = LY_EINVAL;
              ly_log(lybctx->lybctx->ctx,LY_LLERR,LY_EINVAL,
                     "Failed to parse node \"%s\" as nested extension instance data.",pcVar15);
            }
          }
          else {
            LVar5 = LY_EMEM;
            pcVar15 = name;
          }
          free(pcVar15);
          if (LVar5 == LY_SUCCESS) goto LAB_00136420;
        }
        goto LAB_00136d84;
      }
      if (lyb_type != LYB_NODE_TOP) goto LAB_0013641d;
      LVar5 = lyb_parse_model(lybctx->lybctx,(lybctx->field_1).field_0.parse_opts,'\0',&mod);
      if (LVar5 == LY_SUCCESS) {
        plVar7 = (lysc_node *)0x0;
        mod_00 = mod;
        goto LAB_00136402;
      }
LAB_00136413:
      pcVar14 = (char *)0x0;
    }
    goto LAB_00136d84;
  }
  goto LAB_0013717a;
LAB_00136855:
  ly_log_location_revert(0,1,0,0);
LAB_00136cef:
  lyd_free_meta_siblings(meta);
  lyd_free_tree((lyd_node *)name);
LAB_00136d84:
  free(pcVar14);
  if (LVar5 != LY_SUCCESS) {
    return LVar5;
  }
  if (((char)local_a8 == '\0') && ((lybctx->int_opts & 0x20) == 0)) {
    plVar12 = lybctx->lybctx;
LAB_0013717a:
    LVar5 = lyb_read_stop_siblings(plVar12);
    return LVar5;
  }
  goto LAB_00136361;
}

Assistant:

static LY_ERR
lyb_parse_siblings(struct lyd_lyb_ctx *lybctx, struct lyd_node *parent, struct lyd_node **first_p,
        struct ly_set *parsed)
{
    ly_bool top_level;

    top_level = !LY_ARRAY_COUNT(lybctx->lybctx->siblings);

    /* register a new siblings */
    LY_CHECK_RET(lyb_read_start_siblings(lybctx->lybctx));

    while (LYB_LAST_SIBLING(lybctx->lybctx).written) {
        LY_CHECK_RET(lyb_parse_node(lybctx, parent, first_p, parsed));

        if (top_level && !(lybctx->int_opts & LYD_INTOPT_WITH_SIBLINGS)) {
            break;
        }
    }

    /* end the siblings */
    LY_CHECK_RET(lyb_read_stop_siblings(lybctx->lybctx));

    return LY_SUCCESS;
}